

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzFind.cpp
# Opt level: O0

void crnlib::MatchFinder_MoveBlock(CMatchFinder *p)

{
  long *in_RDI;
  
  memmove((void *)in_RDI[8],(void *)(*in_RDI - (ulong)*(uint *)(in_RDI + 0xb)),
          (ulong)(uint)(((int)in_RDI[2] - (int)in_RDI[1]) + (int)in_RDI[0xb]));
  *in_RDI = in_RDI[8] + (ulong)*(uint *)(in_RDI + 0xb);
  return;
}

Assistant:

void MatchFinder_MoveBlock(CMatchFinder* p) {
  memmove(p->bufferBase,
          p->buffer - p->keepSizeBefore,
          (size_t)(p->streamPos - p->pos + p->keepSizeBefore));
  p->buffer = p->bufferBase + p->keepSizeBefore;
}